

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmGetPropertyCommand::HandleVariableMode(cmGetPropertyCommand *this)

{
  ulong uVar1;
  char *value;
  allocator<char> local_39;
  string local_38;
  cmGetPropertyCommand *local_18;
  cmGetPropertyCommand *this_local;
  
  local_18 = this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"given name for VARIABLE scope.",&local_39);
    cmCommand::SetError(&this->super_cmCommand,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    this_local._7_1_ = false;
  }
  else {
    value = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,&this->PropertyName);
    this_local._7_1_ = StoreResult(this,value);
  }
  return this_local._7_1_;
}

Assistant:

bool cmGetPropertyCommand::HandleVariableMode()
{
  if (!this->Name.empty()) {
    this->SetError("given name for VARIABLE scope.");
    return false;
  }

  return this->StoreResult(this->Makefile->GetDefinition(this->PropertyName));
}